

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int handle_message(sockaddr_in addr,int from_id)

{
  uint uVar1;
  size_type sVar2;
  _Rb_tree_node_base *p_Var3;
  uchar extraout_RDX [8];
  ulong __n;
  undefined8 uVar4;
  sockaddr_in addr_00;
  int from_id_local;
  allocator aStack_186f9;
  string str_addr;
  string asStack_186d8 [32];
  char message [100000];
  
  uVar4 = addr._0_8_;
  from_id_local = from_id;
  sVar2 = std::set<int,_std::less<int>,_std::allocator<int>_>::count(&children,&from_id_local);
  if (sVar2 == 0) {
    if (flag_root != false) {
      return 0;
    }
    if (from_id_local != id_parent) {
      return 0;
    }
  }
  addr_00.sin_zero[0] = extraout_RDX[0];
  addr_00.sin_zero[1] = extraout_RDX[1];
  addr_00.sin_zero[2] = extraout_RDX[2];
  addr_00.sin_zero[3] = extraout_RDX[3];
  addr_00.sin_zero[4] = extraout_RDX[4];
  addr_00.sin_zero[5] = extraout_RDX[5];
  addr_00.sin_zero[6] = extraout_RDX[6];
  addr_00.sin_zero[7] = extraout_RDX[7];
  addr_00.sin_family = (short)uVar4;
  addr_00.sin_port = (short)((ulong)uVar4 >> 0x10);
  addr_00.sin_addr.s_addr = (int)((ulong)uVar4 >> 0x20);
  pack_address_abi_cxx11_(&str_addr,addr_00);
  fprintf(_stderr,"Message from: %s\n",str_addr._M_dataplus._M_p);
  uVar1 = *(uint *)((long)buf + 8);
  __n = (ulong)(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18);
  strncpy(message,(char *)((long)buf + 0xc),__n);
  message[__n] = '\0';
  fprintf(_stderr,"%s\n",message);
  std::__cxx11::string::string(asStack_186d8,message,&aStack_186f9);
  std::__cxx11::string::operator=((string *)&tosend_message_abi_cxx11_,asStack_186d8);
  std::__cxx11::string::~string(asStack_186d8);
  if ((flag_root == false) && (from_id_local != id_parent)) {
    fprintf(_stderr,"Vajno!!! %d %d\n");
    fprintf(_stderr,anon_var_dwarf_12a1d,children._M_t._M_impl.super__Rb_tree_header._M_node_count);
    create_new_message(1,id_parent);
    p_Var3 = children._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  }
  else {
    fwrite("No resend parent\n",0x11,1,_stderr);
    p_Var3 = children._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  }
  for (; (_Rb_tree_header *)p_Var3 != &children._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    if (p_Var3[1]._M_color != from_id_local) {
      create_new_message(1,p_Var3[1]._M_color);
    }
  }
  std::__cxx11::string::~string((string *)&str_addr);
  return 1;
}

Assistant:

int handle_message(struct sockaddr_in addr, int from_id) {
    // if only on children or parent
    if (!children.count(from_id) && (flag_root || !flag_root && from_id != id_parent)) {
        return 0;
    }
    // ttl on new connector

    std::string str_addr = pack_address(addr);
    fprintf(stderr, "Message from: %s\n", str_addr.c_str());

    char message[MESSAGE_MAX_SIZE];
    size_t size_message = ntohl(((uint32_t*)buf)[2]);
    strncpy(message, (char*)buf + 3 * sizeof(int), size_message);
    message[size_message] = '\0';
    fprintf(stderr, "%s\n", message);

    tosend_message = std::string(message);
    if (!flag_root && from_id != id_parent) {
        fprintf(stderr, "Vajno!!! %d %d\n", from_id, id_parent);
        fprintf(stderr, "Сhildren size: %ld\n", children.size());
        create_new_message(MSG, id_parent);
    }
    else {
        fprintf(stderr, "No resend parent\n");
    }
    for (auto ch : children) {
        if (ch != from_id) {
            create_new_message(MSG, ch);
        }
    }
    return 1;
}